

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O3

void __thiscall ValueType::ToString(ValueType *this,char (*str) [256])

{
  Type TVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar2;
  Type TVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar4;
  char *pcVar5;
  char *_Src;
  bool bVar6;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_38;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  byte local_33;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [2];
  ValueType definiteType;
  ValueType generalizedType;
  
  TVar1 = (this->field_0).bits;
  if (((TVar1 & ~CanBeTaggedValue) == Likely) || (DAT_015bc46a == '\x01')) {
    ToVerboseString(this,str);
    return;
  }
  bVar6 = (TVar1 & (Object|Likely)) != Object;
  aVar2.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)ToDefinite(this);
  local_36.field_0 = aVar2.field_0;
  ValueType((ValueType *)&local_32[0].field_0);
  local_33 = bVar6;
  aVar4.field_0 = aVar2.field_0;
  if (((ushort)aVar2 & 0xff37) != 0x20) {
    if ((aVar2.bits & ~(Number|IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue)) == Float)
    {
      local_32[0].bits = Float|CanBeTaggedValue;
      aVar4.bits = local_32[0].bits;
    }
    else {
      if (((ushort)aVar2 & 0xfc17) != 0 || ((ushort)aVar2 & 800) == 0) {
        TVar3 = aVar2.bits & ~CanBeTaggedValue;
        if (TVar3 < Boolean) {
          if (TVar3 == Undefined) {
            local_32[0].bits = Undefined;
            aVar4.bits = local_32[0].bits;
            goto LAB_00b1433e;
          }
          if (TVar3 == Null) {
            local_32[0].bits = Null;
            aVar4.bits = local_32[0].bits;
            goto LAB_00b1433e;
          }
        }
        else {
          if (TVar3 == Boolean) {
            local_32[0].bits = Boolean;
            aVar4.bits = local_32[0].bits;
            goto LAB_00b1433e;
          }
          if (TVar3 == String) {
            local_32[0].bits = String;
            aVar4.bits = local_32[0].bits;
            goto LAB_00b1433e;
          }
          if (TVar3 == Symbol) {
            local_32[0].bits = Symbol;
            aVar4.bits = local_32[0].bits;
            goto LAB_00b1433e;
          }
        }
        if ((((ushort)aVar2 & 0xa011) == 0 && ((ushort)aVar2 & 0x5f26) != 0) &&
           (TVar3 = (this->field_0).bits, (TVar3 & Object) == 0)) {
          pcVar5 = "Primitive";
          _Src = "LikelyPrimitive";
        }
        else {
          if (((ushort)aVar2 & 0x10) != 0) {
            local_32[0].field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ToDefiniteObject((ValueType *)&local_36.field_0);
            aVar4.field_0 = local_32[0].field_0;
            if (((ushort)aVar2 & 0x17) != 0x10) {
              ValueType((ValueType *)&local_3e.field_0,local_32[0].bits | (CanBeTaggedValue|Likely))
              ;
              Verify((ValueType)local_3e.field_0);
              aVar4 = local_3e;
            }
            goto LAB_00b1433e;
          }
          TVar3 = (this->field_0).bits;
          pcVar5 = "Mixed";
          _Src = "LikelyMixed";
        }
        if ((TVar3 & Likely) == 0) {
          _Src = pcVar5;
        }
        strcpy_s<256ul>(str,_Src);
        return;
      }
      local_32[0].bits = Number|CanBeTaggedValue;
      aVar4.bits = local_32[0].bits;
      if (((ushort)aVar2 & 0x120) == 0x20) {
        ValueType((ValueType *)&local_3c.field_0,
                  (ushort)(((ushort)aVar2 & 0xa8) != 0x28) << 7 |
                  (IntCanBeUntagged|Int|CanBeTaggedValue));
        Verify((ValueType)local_3c.field_0);
        Verify((ValueType)local_32[0].field_0);
        Verify((ValueType)local_3c.field_0);
        aVar4 = local_3c;
        if (local_32[0].bits != local_3c.bits) {
          ValueType((ValueType *)&local_3a.field_0,local_32[0].bits | local_3c.bits);
          if ((local_3a.bits & Object) == 0) {
            Verify((ValueType)local_3a.field_0);
            aVar4 = local_3a;
          }
          else {
            aVar4.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 MergeWithObject((ValueType *)&local_32[0].field_0,local_3c.field_0);
          }
        }
      }
    }
  }
LAB_00b1433e:
  local_32[0] = aVar4;
  bVar6 = (bool)((byte)TVar1 >> 3 & local_33);
  if (((ushort)this->field_0 & 1) != 0) {
    ValueType((ValueType *)&local_40.field_0,local_32[0].bits | (CanBeTaggedValue|Likely));
    Verify((ValueType)local_40);
    local_32[0].field_0 = local_40.field_0;
  }
  local_38.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       SetCanBeTaggedValue((ValueType *)&local_32[0].field_0,bVar6);
  ToVerboseString((ValueType *)&local_38.field_0,str);
  return;
}

Assistant:

void ValueType::ToString(char (&str)[VALUE_TYPE_MAX_STRING_SIZE]) const
{
    if(IsUninitialized() || CONFIG_FLAG(Verbose))
    {
        ToVerboseString(str);
        return;
    }

    bool canBeTaggedValue = CanBeTaggedValue();
    const ValueType definiteType = ToDefinite();
    ValueType generalizedType;
    if(definiteType.IsInt())
        generalizedType = definiteType;
    else if(definiteType.IsFloat())
        generalizedType = Float;
    else if(definiteType.IsNumber())
    {
        generalizedType = Number;
        if(definiteType.IsLikelyInt())
            generalizedType = generalizedType.Merge(GetInt(definiteType.IsLikelyTaggedInt()));
    }
    else if(definiteType.IsUndefined())
        generalizedType = Undefined;
    else if(definiteType.IsNull())
        generalizedType = Null;
    else if(definiteType.IsBoolean())
        generalizedType = Boolean;
    else if (definiteType.IsString())
        generalizedType = String;
    else if (definiteType.IsSymbol())
        generalizedType = Symbol;
    else if(definiteType.IsPrimitive() && !IsLikelyObject())
    {
        strcpy_s(str, IsDefinite() ? "Primitive" : "LikelyPrimitive");
        return;
    }
    else if(definiteType.IsLikelyObject())
    {
        generalizedType = definiteType.ToDefiniteObject();
        if(!definiteType.IsObject())
            generalizedType = generalizedType.ToLikely();
    }
    else
    {
        strcpy_s(str, IsDefinite() ? "Mixed" : "LikelyMixed");
        return;
    }

    if(!IsDefinite())
        generalizedType = generalizedType.ToLikely();
    generalizedType.SetCanBeTaggedValue(canBeTaggedValue).ToVerboseString(str);
}